

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_horz_only_frame_superres_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_29ca355::ConvolveHorizRSTestBase<unsigned_char>::Prep
          (ConvolveHorizRSTestBase<unsigned_char> *this,ACMRandom *rnd)

{
  PrepBuffers<unsigned_char>
            (rnd,*(int *)&(this->super_Test)._vptr_Test,
             *(int *)&(this->super_Test).gtest_flag_saver_._M_t.
                      super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
                      .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>.
                      _M_head_impl,*(int *)&this->image_,*(int *)&this->field_0x14,false,
             (uchar *)this[1].super_Test._vptr_Test);
  PrepBuffers<unsigned_char>
            (rnd,*(int *)((long)&(this->super_Test)._vptr_Test + 4),
             *(int *)&(this->super_Test).gtest_flag_saver_._M_t.
                      super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
                      .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>.
                      _M_head_impl,*(int *)((long)&this->image_ + 4),*(int *)&this->field_0x14,true,
             (uchar *)this[1].image_);
  return;
}

Assistant:

void Prep(ACMRandom *rnd) {
    assert(rnd);
    image_->Initialize(rnd);
  }